

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttf.c
# Opt level: O0

void unlock_current_page(ALLEGRO_TTF_FONT_DATA *data)

{
  undefined8 *puVar1;
  ulong uVar2;
  long in_RDI;
  ALLEGRO_BITMAP **back;
  
  if (*(long *)(in_RDI + 0x60) != 0) {
    puVar1 = (undefined8 *)_al_vector_ref_back(in_RDI + 0x30);
    al_unlock_bitmap(*puVar1);
    *(undefined8 *)(in_RDI + 0x60) = 0;
    uVar2 = _al_trace_prefix(__al_debug_channel,0,
                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/ttf/ttf.c"
                             ,0xa6,"unlock_current_page");
    if ((uVar2 & 1) != 0) {
      _al_trace_suffix("Unlocking page: %p\n",*puVar1);
    }
  }
  return;
}

Assistant:

static void unlock_current_page(ALLEGRO_TTF_FONT_DATA *data)
{
   if (data->page_lr) {
      ALLEGRO_BITMAP **back = _al_vector_ref_back(&data->page_bitmaps);
      ASSERT(al_is_bitmap_locked(*back));
      al_unlock_bitmap(*back);
      data->page_lr = NULL;
      ALLEGRO_DEBUG("Unlocking page: %p\n", *back);
   }
}